

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SelectDocsize(Fts3Table *pTab,sqlite3_int64 iDocid,sqlite3_stmt **ppStmt)

{
  int iVar1;
  sqlite_int64 *in_RDX;
  sqlite3_stmt *in_RSI;
  int rc;
  sqlite3_stmt *pStmt;
  sqlite3_value **in_stack_00000148;
  sqlite3_stmt **in_stack_00000150;
  int in_stack_0000015c;
  Fts3Table *in_stack_00000160;
  sqlite3_stmt *pStmt_00;
  
  pStmt_00 = (sqlite3_stmt *)0x0;
  iVar1 = fts3SqlStmt(in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_00000148);
  if (iVar1 == 0) {
    sqlite3_bind_int64(in_RSI,(int)((ulong)in_RDX >> 0x20),(sqlite_int64)pStmt_00);
    iVar1 = sqlite3_step(pStmt);
    if ((iVar1 == 100) && (iVar1 = sqlite3_column_type(pStmt_00,100), iVar1 == 4)) {
      iVar1 = 0;
    }
    else {
      iVar1 = sqlite3_reset(pStmt_00);
      if (iVar1 == 0) {
        iVar1 = 0x10b;
      }
      pStmt_00 = (sqlite3_stmt *)0x0;
    }
  }
  *in_RDX = (sqlite_int64)pStmt_00;
  return iVar1;
}

Assistant:

static int fts3SelectDocsize(
  Fts3Table *pTab,                /* FTS3 table handle */
  sqlite3_int64 iDocid,           /* Docid to bind for SQL_SELECT_DOCSIZE */
  sqlite3_stmt **ppStmt           /* OUT: Statement handle */
){
  sqlite3_stmt *pStmt = 0;        /* Statement requested from fts3SqlStmt() */
  int rc;                         /* Return code */

  rc = fts3SqlStmt(pTab, SQL_SELECT_DOCSIZE, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pStmt, 1, iDocid);
    rc = sqlite3_step(pStmt);
    if( rc!=SQLITE_ROW || sqlite3_column_type(pStmt, 0)!=SQLITE_BLOB ){
      rc = sqlite3_reset(pStmt);
      if( rc==SQLITE_OK ) rc = FTS_CORRUPT_VTAB;
      pStmt = 0;
    }else{
      rc = SQLITE_OK;
    }
  }

  *ppStmt = pStmt;
  return rc;
}